

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticAnalyser.cpp
# Opt level: O0

TargetList *
Analyser::Static::Coleco::GetTargets
          (TargetList *__return_storage_ptr__,Media *media,string *param_2,IntType param_3)

{
  bool bVar1;
  pointer pTVar2;
  vector<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  local_60;
  undefined4 local_34;
  unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_> local_30;
  __single_object target;
  IntType param_2_local;
  string *param_1_local;
  Media *media_local;
  TargetList *targets;
  
  target._M_t.
  super___uniq_ptr_impl<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>.
  _M_t.
  super__Tuple_impl<0UL,_Analyser::Static::Target_*,_std::default_delete<Analyser::Static::Target>_>
  .super__Head_base<0UL,_Analyser::Static::Target_*,_false>._M_head_impl._3_1_ = 0;
  target._M_t.
  super___uniq_ptr_impl<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>.
  _M_t.
  super__Tuple_impl<0UL,_Analyser::Static::Target_*,_std::default_delete<Analyser::Static::Target>_>
  .super__Head_base<0UL,_Analyser::Static::Target_*,_false>._M_head_impl._4_4_ = param_3;
  std::
  vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
  ::vector(__return_storage_ptr__);
  local_34 = 6;
  std::make_unique<Analyser::Static::Target,Analyser::Machine>((Machine *)&local_30);
  pTVar2 = std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
           ::operator->(&local_30);
  pTVar2->confidence = 0.9999695;
  ColecoCartridgesFrom(&local_60,&media->cartridges);
  pTVar2 = std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
           ::operator->(&local_30);
  std::
  vector<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ::operator=(&(pTVar2->media).cartridges,&local_60);
  std::
  vector<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ::~vector(&local_60);
  pTVar2 = std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
           ::operator->(&local_30);
  bVar1 = Media::empty(&pTVar2->media);
  if (!bVar1) {
    std::
    vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    ::push_back(__return_storage_ptr__,&local_30);
  }
  target._M_t.
  super___uniq_ptr_impl<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>.
  _M_t.
  super__Tuple_impl<0UL,_Analyser::Static::Target_*,_std::default_delete<Analyser::Static::Target>_>
  .super__Head_base<0UL,_Analyser::Static::Target_*,_false>._M_head_impl._3_1_ = 1;
  std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>::
  ~unique_ptr(&local_30);
  if ((target._M_t.
       super___uniq_ptr_impl<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
       ._M_t.
       super__Tuple_impl<0UL,_Analyser::Static::Target_*,_std::default_delete<Analyser::Static::Target>_>
       .super__Head_base<0UL,_Analyser::Static::Target_*,_false>._M_head_impl._3_1_ & 1) == 0) {
    std::
    vector<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Analyser::Static::TargetList Analyser::Static::Coleco::GetTargets(const Media &media, const std::string &, TargetPlatform::IntType) {
	TargetList targets;
	auto target = std::make_unique<Target>(Machine::ColecoVision);
	target->confidence = 1.0f - 1.0f / 32768.0f;
	target->media.cartridges = ColecoCartridgesFrom(media.cartridges);
	if(!target->media.empty())
		targets.push_back(std::move(target));
	return targets;
}